

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

bool QConfFileSettingsPrivate::readIniLine
               (QByteArrayView data,qsizetype *dataPos,qsizetype *lineStart,qsizetype *lineLen,
               qsizetype *equalsPos)

{
  byte bVar1;
  bool bVar2;
  qsizetype qVar3;
  long lVar4;
  long *in_RCX;
  long *in_RDX;
  long *in_R8;
  long *in_R9;
  long in_FS_OFFSET;
  bool bVar5;
  char ch2;
  char ch_1;
  char ch;
  qsizetype i;
  bool inQuotes;
  qsizetype dataLen;
  anon_enum_32 Special;
  anon_enum_32 Space;
  qsizetype in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 uVar6;
  char in_stack_ffffffffffffffa5;
  char in_stack_ffffffffffffffa6;
  byte in_stack_ffffffffffffffa7;
  long local_58;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QByteArrayView::size(&local_18);
  bVar2 = false;
  *in_R9 = -1;
  *in_RCX = *in_RDX;
  while( true ) {
    bVar5 = false;
    if (*in_RCX < qVar3) {
      bVar1 = QByteArrayView::at((QByteArrayView *)
                                 CONCAT17(in_stack_ffffffffffffffa7,
                                          CONCAT16(in_stack_ffffffffffffffa6,
                                                   CONCAT15(in_stack_ffffffffffffffa5,
                                                            (uint5)CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))),
                                 in_stack_ffffffffffffff98);
      bVar5 = (SettingsImpl::charTraits[bVar1] & 1) != 0;
    }
    if (!bVar5) break;
    *in_RCX = *in_RCX + 1;
  }
  uVar6 = 0;
  lVar4 = *in_RCX;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          local_58 = lVar4;
          if (qVar3 <= local_58) goto LAB_007b16d6;
          in_stack_ffffffffffffffa7 =
               QByteArrayView::at((QByteArrayView *)
                                  CONCAT17(in_stack_ffffffffffffffa7,
                                           CONCAT16(in_stack_ffffffffffffffa6,
                                                    CONCAT15(in_stack_ffffffffffffffa5,
                                                             CONCAT14(uVar6,CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                                  ,in_stack_ffffffffffffff98);
          while ((SettingsImpl::charTraits[in_stack_ffffffffffffffa7] & 2) == 0) {
            local_58 = local_58 + 1;
            if (local_58 == qVar3) goto LAB_007b16d6;
            in_stack_ffffffffffffffa7 =
                 QByteArrayView::at((QByteArrayView *)
                                    CONCAT17(in_stack_ffffffffffffffa7,
                                             CONCAT16(in_stack_ffffffffffffffa6,
                                                      CONCAT15(in_stack_ffffffffffffffa5,
                                                               CONCAT14(uVar6,CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                                    ,in_stack_ffffffffffffff98);
          }
          lVar4 = local_58 + 1;
          if (in_stack_ffffffffffffffa7 != 0x3d) break;
          if ((!bVar2) && (*in_R9 == -1)) {
            *in_R9 = local_58;
          }
        }
        if ((in_stack_ffffffffffffffa7 == 10) || (in_stack_ffffffffffffffa7 == 0xd)) break;
        if (in_stack_ffffffffffffffa7 == 0x5c) {
          if (lVar4 < qVar3) {
            lVar4 = local_58 + 2;
            in_stack_ffffffffffffffa6 =
                 QByteArrayView::at((QByteArrayView *)
                                    CONCAT17(0x5c,CONCAT16(in_stack_ffffffffffffffa6,
                                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                                    CONCAT14(uVar6,CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                                    ,in_stack_ffffffffffffff98);
            if ((lVar4 < qVar3) &&
               (((in_stack_ffffffffffffffa5 =
                       QByteArrayView::at((QByteArrayView *)
                                          CONCAT17(in_stack_ffffffffffffffa7,
                                                   CONCAT16(in_stack_ffffffffffffffa6,
                                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                                     CONCAT14(uVar6,CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           CONCAT11(in_stack_ffffffffffffffa1,
                                                                    in_stack_ffffffffffffffa0)))))))
                                          ,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffffa6 == '\n' && (in_stack_ffffffffffffffa5 == '\r')) ||
                ((in_stack_ffffffffffffffa6 == '\r' && (in_stack_ffffffffffffffa5 == '\n')))))) {
              lVar4 = local_58 + 3;
            }
          }
        }
        else if (in_stack_ffffffffffffffa7 == 0x22) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else if (lVar4 == *in_RCX + 1) {
          while( true ) {
            local_58 = lVar4;
            bVar5 = false;
            if (local_58 < qVar3) {
              in_stack_ffffffffffffffa7 =
                   QByteArrayView::at((QByteArrayView *)
                                      CONCAT17(in_stack_ffffffffffffffa7,
                                               CONCAT16(in_stack_ffffffffffffffa6,
                                                        CONCAT15(in_stack_ffffffffffffffa5,
                                                                 CONCAT14(uVar6,(uint)CONCAT12(
                                                  in_stack_ffffffffffffffa2,
                                                  CONCAT11(in_stack_ffffffffffffffa1,
                                                           in_stack_ffffffffffffffa0)))))),
                                      in_stack_ffffffffffffff98);
              in_stack_ffffffffffffffa2 =
                   in_stack_ffffffffffffffa7 != 10 && in_stack_ffffffffffffffa7 != 0xd;
              bVar5 = (bool)in_stack_ffffffffffffffa2;
            }
            if (!bVar5) break;
            lVar4 = local_58 + 1;
          }
          in_stack_ffffffffffffffa3 = 0;
          while( true ) {
            bVar5 = false;
            if (local_58 < qVar3) {
              bVar1 = QByteArrayView::at((QByteArrayView *)
                                         CONCAT17(in_stack_ffffffffffffffa7,
                                                  CONCAT16(in_stack_ffffffffffffffa6,
                                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                                    CONCAT14(uVar6,CONCAT13(
                                                  in_stack_ffffffffffffffa3,
                                                  CONCAT12(in_stack_ffffffffffffffa2,
                                                           (ushort)in_stack_ffffffffffffffa0)))))),
                                         in_stack_ffffffffffffff98);
              bVar5 = (SettingsImpl::charTraits[bVar1] & 1) != 0;
            }
            if (!bVar5) break;
            local_58 = local_58 + 1;
          }
          *in_RCX = local_58;
          in_stack_ffffffffffffffa1 = 0;
          lVar4 = local_58;
        }
        else if (!bVar2) goto LAB_007b16d6;
      }
      if (lVar4 != *in_RCX + 1) break;
      *in_RCX = *in_RCX + 1;
    }
  } while (bVar2);
LAB_007b16d6:
  *in_RDX = local_58;
  *in_R8 = local_58 - *in_RCX;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0 < *in_R8;
  }
  __stack_chk_fail();
}

Assistant:

bool QConfFileSettingsPrivate::readIniLine(QByteArrayView data, qsizetype &dataPos,
                                           qsizetype &lineStart, qsizetype &lineLen,
                                           qsizetype &equalsPos)
{
    constexpr auto Space = SettingsImpl::Space;
    constexpr auto Special = SettingsImpl::Special;
    qsizetype dataLen = data.size();
    bool inQuotes = false;

    equalsPos = -1;

    lineStart = dataPos;
    while (lineStart < dataLen && (charTraits[uint(uchar(data.at(lineStart)))] & Space))
        ++lineStart;

    qsizetype i = lineStart;
    while (i < dataLen) {
        char ch = data.at(i);
        while (!(charTraits[uchar(ch)] & Special)) {
            if (++i == dataLen)
                goto break_out_of_outer_loop;
            ch = data.at(i);
        }

        ++i;
        if (ch == '=') {
            if (!inQuotes && equalsPos == -1)
                equalsPos = i - 1;
        } else if (ch == '\n' || ch == '\r') {
            if (i == lineStart + 1) {
                ++lineStart;
            } else if (!inQuotes) {
                --i;
                goto break_out_of_outer_loop;
            }
        } else if (ch == '\\') {
            if (i < dataLen) {
                char ch = data.at(i++);
                if (i < dataLen) {
                    char ch2 = data.at(i);
                    // \n, \r, \r\n, and \n\r are legitimate line terminators in INI files
                    if ((ch == '\n' && ch2 == '\r') || (ch == '\r' && ch2 == '\n'))
                        ++i;
                }
            }
        } else if (ch == '"') {
            inQuotes = !inQuotes;
        } else {
            Q_ASSERT(ch == ';');

            if (i == lineStart + 1) {
                while (i < dataLen && (((ch = data.at(i)) != '\n') && ch != '\r'))
                    ++i;
                while (i < dataLen && charTraits[uchar(data.at(i))] & Space)
                    ++i;
                lineStart = i;
            } else if (!inQuotes) {
                --i;
                goto break_out_of_outer_loop;
            }
        }
    }

break_out_of_outer_loop:
    dataPos = i;
    lineLen = i - lineStart;
    return lineLen > 0;
}